

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall
QDomElementPrivate::setAttribute(QDomElementPrivate *this,QString *aname,QString *newValue)

{
  QDomNodePrivate *pQVar1;
  QDomDocumentPrivate *d;
  
  pQVar1 = QDomNamedNodeMapPrivate::namedItem(this->m_attr,aname);
  if (pQVar1 != (QDomNodePrivate *)0x0) {
    (*pQVar1->_vptr_QDomNodePrivate[2])(pQVar1,newValue);
    return;
  }
  pQVar1 = (QDomNodePrivate *)operator_new(0xa8);
  d = QDomNodePrivate::ownerDocument(&this->super_QDomNodePrivate);
  QDomAttrPrivate::QDomAttrPrivate((QDomAttrPrivate *)pQVar1,d,&this->super_QDomNodePrivate,aname);
  (*pQVar1->_vptr_QDomNodePrivate[2])(pQVar1,newValue);
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  QDomNamedNodeMapPrivate::setNamedItem(this->m_attr,pQVar1);
  return;
}

Assistant:

void QDomElementPrivate::setAttribute(const QString& aname, const QString& newValue)
{
    QDomNodePrivate* n = m_attr->namedItem(aname);
    if (!n) {
        n = new QDomAttrPrivate(ownerDocument(), this, aname);
        n->setNodeValue(newValue);

        // Referencing is done by the map, so we set the reference counter back
        // to 0 here. This is ok since we created the QDomAttrPrivate.
        n->ref.deref();
        m_attr->setNamedItem(n);
    } else {
        n->setNodeValue(newValue);
    }
}